

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap_str.c
# Opt level: O0

int ap_str_to_hex(char *str,char **hex_str)

{
  size_t sVar1;
  char *pcVar2;
  ulong local_38;
  size_t i;
  size_t str_len;
  char *s;
  int rc;
  char **hex_str_local;
  char *str_local;
  
  s._4_4_ = 0;
  sVar1 = strlen(str);
  pcVar2 = (char *)malloc(sVar1 * 2 + 1);
  if (pcVar2 == (char *)0x0) {
    s._4_4_ = 4;
  }
  else {
    for (local_38 = 0; local_38 < sVar1; local_38 = local_38 + 1) {
      pcVar2[local_38 * 2] = ap_str_to_hex::hex_tab[(int)str[local_38] >> 4];
      pcVar2[local_38 * 2 + 1] = ap_str_to_hex::hex_tab[(int)((int)str[local_38] & 0xf)];
    }
    pcVar2[sVar1 * 2] = '\0';
    *hex_str = pcVar2;
  }
  return s._4_4_;
}

Assistant:

int ap_str_to_hex (const char *str, char **hex_str)
{
	static unsigned char hex_tab[16] = "0123456789ABCDEF";

	int		rc			= AP_NO_ERROR;
	char	*s			= NULL;
	size_t	str_len;
	size_t	i;

	str_len = strlen (str);

	s = malloc (str_len * 2 + 1);
	if (s == NULL)
	{
		rc = AP_ERROR_NO_MEMORY;

		goto finish;
	}

	for (i = 0; i < str_len; i ++)
	{
		s[i * 2] = hex_tab[str[i] >> 4];
		s[i * 2 + 1] = hex_tab[str[i] & 0x0F];
	}

	s[str_len * 2] = '\0';

	*hex_str = s;

finish:
	return rc;
}